

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAPI.c
# Opt level: O0

int Cudd_RemoveHook(DdManager *dd,DD_HFP f,Cudd_HookType where)

{
  DD_HFP local_38;
  DdHook *nextHook;
  DdHook **hook;
  Cudd_HookType where_local;
  DD_HFP f_local;
  DdManager *dd_local;
  
  switch(where) {
  case CUDD_PRE_GC_HOOK:
    nextHook = (DdHook *)&dd->preGCHook;
    break;
  case CUDD_POST_GC_HOOK:
    nextHook = (DdHook *)&dd->postGCHook;
    break;
  case CUDD_PRE_REORDERING_HOOK:
    nextHook = (DdHook *)&dd->preReorderingHook;
    break;
  case CUDD_POST_REORDERING_HOOK:
    nextHook = (DdHook *)&dd->postReorderingHook;
    break;
  default:
    return 0;
  }
  local_38 = nextHook->f;
  while( true ) {
    if (local_38 == (DD_HFP)0x0) {
      return 0;
    }
    if (*(DD_HFP *)local_38 == f) break;
    nextHook = (DdHook *)(local_38 + 8);
    local_38 = *(DD_HFP *)(local_38 + 8);
  }
  nextHook->f = *(DD_HFP *)(local_38 + 8);
  if (local_38 != (DD_HFP)0x0) {
    free(local_38);
  }
  return 1;
}

Assistant:

int
Cudd_RemoveHook(
  DdManager * dd,
  DD_HFP f,
  Cudd_HookType where)
{
    DdHook **hook, *nextHook;

    switch (where) {
    case CUDD_PRE_GC_HOOK:
        hook = &(dd->preGCHook);
        break;
    case CUDD_POST_GC_HOOK:
        hook = &(dd->postGCHook);
        break;
    case CUDD_PRE_REORDERING_HOOK:
        hook = &(dd->preReorderingHook);
        break;
    case CUDD_POST_REORDERING_HOOK:
        hook = &(dd->postReorderingHook);
        break;
    default:
        return(0);
    }
    nextHook = *hook;
    while (nextHook != NULL) {
        if (nextHook->f == f) {
            *hook = nextHook->next;
            ABC_FREE(nextHook);
            return(1);
        }
        hook = &(nextHook->next);
        nextHook = nextHook->next;
    }

    return(0);

}